

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::SetTrackerData
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,void *address,void *data)

{
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  void **ppvVar4;
  undefined8 *in_FS_OFFSET;
  void *existingTrackerData;
  ushort index;
  void *data_local;
  void *address_local;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  bVar2 = Recycler::DoProfileAllocTracker();
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x8da,"(Recycler::DoProfileAllocTracker())",
                       "Recycler::DoProfileAllocTracker()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  uVar3 = GetAddressIndex(this,address);
  if (uVar3 == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x8dc,"(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)",
                       "index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  ppvVar4 = GetTrackerDataArray(this);
  if (((((TrackerData *)ppvVar4[uVar3] != (TrackerData *)0x0) && (data != (void *)0x0)) &&
      ((TrackerData *)ppvVar4[uVar3] != &Recycler::TrackerData::ExplicitFreeListObjectData)) &&
     ((TrackerData *)data != &Recycler::TrackerData::ExplicitFreeListObjectData)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x8e0,
                       "((existingTrackerData == nullptr || data == nullptr) || (existingTrackerData == &Recycler::TrackerData::ExplicitFreeListObjectData || data == &Recycler::TrackerData::ExplicitFreeListObjectData))"
                       ,
                       "(existingTrackerData == nullptr || data == nullptr) || (existingTrackerData == &Recycler::TrackerData::ExplicitFreeListObjectData || data == &Recycler::TrackerData::ExplicitFreeListObjectData)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  ppvVar4 = GetTrackerDataArray(this);
  ppvVar4[uVar3] = data;
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::SetTrackerData(void * address, void * data)
{
    Assert(Recycler::DoProfileAllocTracker());
    ushort index = this->GetAddressIndex(address);
    Assert(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);

    void* existingTrackerData = this->GetTrackerDataArray()[index];
    Assert((existingTrackerData == nullptr || data == nullptr) ||
        (existingTrackerData == &Recycler::TrackerData::ExplicitFreeListObjectData || data == &Recycler::TrackerData::ExplicitFreeListObjectData));
    this->GetTrackerDataArray()[index] = data;
}